

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenAtomicNotify
          (BinaryenModuleRef module,BinaryenExpressionRef ptr,BinaryenExpressionRef notifyCount,
          char *memoryName)

{
  AtomicNotify *pAVar1;
  Name memory;
  Builder local_28;
  
  local_28.wasm = module;
  memory = getMemoryName(module,memoryName);
  pAVar1 = wasm::Builder::makeAtomicNotify(&local_28,ptr,notifyCount,(Address)0x0,memory);
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicNotify(BinaryenModuleRef module,
                                           BinaryenExpressionRef ptr,
                                           BinaryenExpressionRef notifyCount,
                                           const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeAtomicNotify((Expression*)ptr,
                        (Expression*)notifyCount,
                        0,
                        getMemoryName(module, memoryName)));
}